

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handshake_client.cc
# Opt level: O0

bool bssl::ssl_add_client_hello(SSL_HANDSHAKE *hs)

{
  SSL *pSVar1;
  _func_bool_SSL_ptr_CBB_ptr_CBB_ptr_uint8_t *p_Var2;
  _func_bool_SSL_ptr_CBB_ptr_Array<unsigned_char>_ptr *p_Var3;
  _func_bool_SSL_ptr_Array<unsigned_char> *p_Var4;
  ssl_client_hello_type_t type_00;
  bool bVar5;
  cbb_st *pcVar6;
  size_t *out_binder_len;
  size_t extraout_RDX;
  Span<unsigned_char> msg_00;
  Array<unsigned_char> AVar7;
  Array<unsigned_char> local_c8;
  Span<unsigned_char> local_b8;
  undefined4 local_a8;
  undefined1 local_98 [8];
  Array<unsigned_char> msg;
  undefined1 local_80 [3];
  bool needs_psk_binder;
  ssl_client_hello_type_t type;
  CBB body;
  ScopedCBB cbb;
  SSL *ssl;
  SSL_HANDSHAKE *hs_local;
  
  pSVar1 = hs->ssl;
  internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::StackAllocated
            ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)((long)&body.u + 0x18));
  bVar5 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&hs->selected_ech_config);
  msg.size_._4_4_ = (uint)bVar5 * 2;
  Array<unsigned_char>::Array((Array<unsigned_char> *)local_98);
  p_Var2 = pSVar1->method->init_message;
  pcVar6 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                     ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                      ((long)&body.u + 0x18));
  bVar5 = (*p_Var2)(pSVar1,pcVar6,(CBB *)local_80,'\x01');
  if ((bVar5) &&
     (bVar5 = ssl_write_client_hello_without_extensions(hs,(CBB *)local_80,msg.size_._4_4_,false),
     type_00 = msg.size_._4_4_, bVar5)) {
    out_binder_len = (size_t *)CBB_len((CBB *)local_80);
    bVar5 = ssl_add_clienthello_tlsext
                      (hs,(CBB *)local_80,(CBB *)0x0,(bool *)((long)&msg.size_ + 3),type_00,
                       (size_t)out_binder_len);
    if (bVar5) {
      p_Var3 = pSVar1->method->finish_message;
      pcVar6 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                         ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                          ((long)&body.u + 0x18));
      bVar5 = (*p_Var3)(pSVar1,pcVar6,(Array<unsigned_char> *)local_98);
      if (bVar5) {
        if ((msg.size_._3_1_ & 1) != 0) {
          if (msg.size_._4_4_ == ssl_client_hello_outer) {
            __assert_fail("type != ssl_client_hello_outer",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                          ,0xf4,"bool bssl::ssl_add_client_hello(SSL_HANDSHAKE *)");
          }
          Span<unsigned_char>::Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
                    (&local_b8,(Array<unsigned_char> *)local_98);
          msg_00.size_ = 0;
          msg_00.data_ = (uchar *)local_b8.size_;
          bVar5 = tls13_write_psk_binder
                            ((bssl *)hs,(SSL_HANDSHAKE *)&hs->transcript,
                             (SSLTranscript *)local_b8.data_,msg_00,out_binder_len);
          if (!bVar5) {
            hs_local._7_1_ = false;
            goto LAB_0017d5ef;
          }
        }
        p_Var4 = pSVar1->method->add_message;
        Array<unsigned_char>::Array(&local_c8,(Array<unsigned_char> *)local_98);
        AVar7.size_ = extraout_RDX;
        AVar7.data_ = (uchar *)&local_c8;
        hs_local._7_1_ = (*p_Var4)(pSVar1,AVar7);
        Array<unsigned_char>::~Array(&local_c8);
        goto LAB_0017d5ef;
      }
    }
  }
  hs_local._7_1_ = false;
LAB_0017d5ef:
  local_a8 = 1;
  Array<unsigned_char>::~Array((Array<unsigned_char> *)local_98);
  internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
            ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)((long)&body.u + 0x18));
  return hs_local._7_1_;
}

Assistant:

bool ssl_add_client_hello(SSL_HANDSHAKE *hs) {
  SSL *const ssl = hs->ssl;
  ScopedCBB cbb;
  CBB body;
  ssl_client_hello_type_t type = hs->selected_ech_config
                                     ? ssl_client_hello_outer
                                     : ssl_client_hello_unencrypted;
  bool needs_psk_binder;
  Array<uint8_t> msg;
  if (!ssl->method->init_message(ssl, cbb.get(), &body, SSL3_MT_CLIENT_HELLO) ||
      !ssl_write_client_hello_without_extensions(hs, &body, type,
                                                 /*empty_session_id=*/false) ||
      !ssl_add_clienthello_tlsext(hs, &body, /*out_encoded=*/nullptr,
                                  &needs_psk_binder, type, CBB_len(&body)) ||
      !ssl->method->finish_message(ssl, cbb.get(), &msg)) {
    return false;
  }

  // Now that the length prefixes have been computed, fill in the placeholder
  // PSK binder.
  if (needs_psk_binder) {
    // ClientHelloOuter cannot have a PSK binder. Otherwise the
    // ClientHellOuterAAD computation would break.
    assert(type != ssl_client_hello_outer);
    if (!tls13_write_psk_binder(hs, hs->transcript, Span(msg),
                                /*out_binder_len=*/0)) {
      return false;
    }
  }

  return ssl->method->add_message(ssl, std::move(msg));
}